

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_CALL(Context *ctx)

{
  size_t in_RCX;
  char labelstr [64];
  char acStack_58 [72];
  
  if (ctx->profile_supports_nv2 != 0) {
    get_ARB1_srcarg_varname(ctx,0,acStack_58,in_RCX);
    output_line(ctx,"CAL %s;",acStack_58);
    return;
  }
  failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  return;
}

Assistant:

static void emit_ARB1_CALL(Context *ctx)
{
    if (!support_nv2(ctx))  // no branching in stock ARB1.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
        return;
    } // if

    char labelstr[64];
    get_ARB1_srcarg_varname(ctx, 0, labelstr, sizeof (labelstr));
    output_line(ctx, "CAL %s;", labelstr);
}